

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

char * dfeature_at(int x,int y,char *buf)

{
  byte bVar1;
  bool bVar2;
  level *plVar3;
  boolean bVar4;
  aligntyp alignment;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *__src;
  
  plVar3 = level;
  bVar1 = level->locations[x][y].typ;
  switch(bVar1) {
  case 0x17:
    uVar6 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f;
    if (uVar6 == 0) {
      lVar9 = 0x18;
LAB_001b23b3:
      bVar2 = false;
      pcVar7 = (char *)0x0;
    }
    else {
      if (uVar6 != 1) {
        if (uVar6 == 2) {
          lVar9 = 0x19;
        }
        else {
          lVar9 = 0x1b;
        }
        goto LAB_001b23b3;
      }
      pcVar7 = "broken door";
      lVar9 = 0xffffffff;
      bVar2 = true;
    }
    iVar5 = is_drawbridge_wall(x,y);
    __src = "open drawbridge portcullis";
    if (iVar5 < 0) {
      __src = pcVar7;
    }
    if (iVar5 < 0 && !bVar2) break;
    goto LAB_001b23e4;
  default:
    bVar4 = is_lava(level,x,y);
    lVar9 = 0x17;
    if (bVar4 != '\0') break;
    bVar4 = is_swamp(level,x,y);
    lVar9 = 0x16;
    if (bVar4 != '\0') break;
    bVar4 = is_ice(level,x,y);
    lVar9 = 0x15;
    if (bVar4 != '\0') break;
    bVar4 = is_pool(level,x,y);
    if (bVar4 == '\0') {
      if (bVar1 == 0x1f) {
        lVar9 = 0x2a;
      }
      else {
        if (bVar1 == 0x21) {
          pcVar7 = a_gname();
          uVar6 = *(uint *)&plVar3->locations[x][y].field_0x6 >> 4 & 0x17;
          if (uVar6 == 0) {
            alignment = -0x80;
          }
          else if (uVar6 == 4) {
            alignment = '\x01';
          }
          else {
            alignment = (char)uVar6 + -2;
          }
          pcVar8 = align_str(alignment);
          __src = dfeature_at::altbuf;
          sprintf(dfeature_at::altbuf,"altar to %s (%s)",pcVar7,pcVar8);
          goto LAB_001b23e9;
        }
        if (((level->sstairs).sx == x) && ((level->sstairs).sy == y)) {
          lVar9 = (ulong)((level->sstairs).up == '\0') + 0x24;
        }
        else if ((((((level->upstair).sx != x) || (lVar9 = 0x20, (level->upstair).sy != y)) &&
                  (((level->dnstair).sx != x || (lVar9 = 0x21, (level->dnstair).sy != y)))) &&
                 (((level->upladder).sx != x || (lVar9 = 0x22, (level->upladder).sy != y)))) &&
                (((level->dnladder).sx != x || (lVar9 = 0x23, (level->dnladder).sy != y)))) {
          if (bVar1 < 0x16) {
            if (bVar1 == 0xc) {
              lVar9 = 0x2e;
            }
            else if (bVar1 == 0xd) {
              lVar9 = 0x1e;
            }
            else {
              if (bVar1 != 0xe) {
                return (char *)0x0;
              }
              lVar9 = 0x1f;
            }
          }
          else {
            if (bVar1 == 0x16) {
              __src = "set of iron bars";
              goto LAB_001b23e9;
            }
            if (bVar1 == 0x20) {
              lVar9 = 0x27;
            }
            else {
              lVar9 = 0x2c;
              if (bVar1 != 0x24) {
                return (char *)0x0;
              }
            }
          }
        }
      }
      break;
    }
    __src = "pool of water";
    goto LAB_001b23e9;
  case 0x1c:
    lVar9 = 0x2b;
    break;
  case 0x1d:
    lVar9 = 0x28;
    break;
  case 0x1e:
    lVar9 = 0x29;
  }
  __src = defexplain[lVar9];
LAB_001b23e4:
  if (__src == (char *)0x0) {
    __src = (char *)0x0;
  }
  else {
LAB_001b23e9:
    strcpy(buf,__src);
  }
  return __src;
}

Assistant:

const char *dfeature_at(int x, int y, char *buf)
{
	struct rm *loc = &level->locations[x][y];
	int ltyp = loc->typ, cmap = -1;
	const char *dfeature = 0;
	static char altbuf[BUFSZ];

	if (IS_DOOR(ltyp)) {
	    switch (loc->doormask) {
	    case D_NODOOR:	cmap = S_ndoor; break;	/* "doorway" */
	    case D_ISOPEN:	cmap = S_vodoor; break;	/* "open door" */
	    case D_BROKEN:	dfeature = "broken door"; break;
	    default:	cmap = S_vcdoor; break;	/* "closed door" */
	    }
	    /* override door description for open drawbridge */
	    if (is_drawbridge_wall(x, y) >= 0)
		dfeature = "open drawbridge portcullis",  cmap = -1;
	} else if (IS_FOUNTAIN(ltyp))
	    cmap = S_fountain;				/* "fountain" */
	else if (IS_THRONE(ltyp))
	    cmap = S_throne;				/* "opulent throne" */
	else if (IS_MAGIC_CHEST(ltyp))
	    cmap = S_magic_chest;			/* "magic chest" */
	else if (is_lava(level, x,y))
	    cmap = S_lava;				/* "molten lava" */
	else if (is_swamp(level, x,y))
	    cmap = S_bog;				/* "muddy swamp" */
	else if (is_ice(level, x, y))
	    cmap = S_ice;				/* "ice" */
	else if (is_pool(level, x,y))
	    dfeature = "pool of water";
	else if (IS_SINK(ltyp))
	    cmap = S_sink;				/* "sink" */
	else if (IS_ALTAR(ltyp)) {
	    sprintf(altbuf, "altar to %s (%s)", a_gname(),
		    align_str(Amask2align(loc->altarmask & ~AM_SHRINE)));
	    dfeature = altbuf;
	} else if (x == level->sstairs.sx && y == level->sstairs.sy && level->sstairs.up)
            cmap = S_upsstair;                          /* "long ladder up" */
        else if (x == level->sstairs.sx && y == level->sstairs.sy)
            cmap = S_dnsstair;                          /* "long ladder down" */
        else if (x == level->upstair.sx && y == level->upstair.sy)
	    cmap = S_upstair;				/* "staircase up" */
	else if (x == level->dnstair.sx && y == level->dnstair.sy)
	    cmap = S_dnstair;				/* "staircase down" */
	else if (x == level->upladder.sx && y == level->upladder.sy)
	    cmap = S_upladder;				/* "ladder up" */
	else if (x == level->dnladder.sx && y == level->dnladder.sy)
	    cmap = S_dnladder;				/* "ladder down" */
	else if (ltyp == DRAWBRIDGE_DOWN)
	    cmap = S_vodbridge;			/* "lowered drawbridge" */
	else if (ltyp == DBWALL)
	    cmap = S_vcdbridge;			/* "raised drawbridge" */
	else if (IS_GRAVE(ltyp))
	    cmap = S_grave;				/* "grave" */
	else if (ltyp == TREE)
	    cmap = S_tree;				/* "tree" */
	else if (ltyp == DEADTREE)
	    cmap = S_deadtree;				/* "dead tree" */
	else if (ltyp == IRONBARS)
	    dfeature = "set of iron bars";

	if (cmap >= 0) dfeature = defexplain[cmap];
	if (dfeature) strcpy(buf, dfeature);
	return dfeature;
}